

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaV_gettable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  int iVar1;
  GCObject *t_00;
  Table *events;
  bool bVar2;
  TValue *pTVar3;
  TValue *o2;
  TValue *unaff_R13;
  TValue *o1;
  int iVar4;
  
  iVar4 = 100;
  do {
    iVar1 = t->tt;
    if ((long)iVar1 == 5) {
      t_00 = (t->value).gc;
      pTVar3 = luaH_get(&t_00->h,key);
      if (pTVar3->tt == 0) {
        events = (t_00->h).metatable;
        if ((events == (Table *)0x0) || ((events->flags & 1) != 0)) {
          unaff_R13 = (TValue *)0x0;
        }
        else {
          unaff_R13 = luaT_gettm(events,TM_INDEX,L->l_G->tmname[0]);
        }
        bVar2 = true;
        if (unaff_R13 == (TValue *)0x0) {
          unaff_R13 = (TValue *)0x0;
          goto LAB_00106ed8;
        }
      }
      else {
LAB_00106ed8:
        val->value = pTVar3->value;
        val->tt = pTVar3->tt;
        bVar2 = false;
      }
      pTVar3 = unaff_R13;
      if (bVar2) goto LAB_00106f40;
LAB_00106f61:
      bVar2 = false;
      unaff_R13 = t;
    }
    else {
      unaff_R13 = luaT_gettmbyobj(L,t,TM_INDEX);
      if (unaff_R13->tt == 0) {
        luaG_runerror(L,"attempt to %s a %s value","index",luaT_typenames[iVar1]);
      }
LAB_00106f40:
      bVar2 = true;
      pTVar3 = unaff_R13;
      if (unaff_R13->tt == 6) {
        callTMres(L,val,unaff_R13,t,key);
        goto LAB_00106f61;
      }
    }
    if (!bVar2) {
      return;
    }
    iVar4 = iVar4 + -1;
    t = unaff_R13;
    unaff_R13 = pTVar3;
    if (iVar4 == 0) {
      luaG_runerror(L,"loop in gettable");
    }
  } while( true );
}

Assistant:

static void luaV_gettable(lua_State*L,const TValue*t,TValue*key,StkId val){
int loop;
for(loop=0;loop<100;loop++){
const TValue*tm;
if(ttistable(t)){
Table*h=hvalue(t);
const TValue*res=luaH_get(h,key);
if(!ttisnil(res)||
(tm=fasttm(L,h->metatable,TM_INDEX))==NULL){
setobj(L,val,res);
return;
}
}
else if(ttisnil(tm=luaT_gettmbyobj(L,t,TM_INDEX)))
luaG_typeerror(L,t,"index");
if(ttisfunction(tm)){
callTMres(L,val,tm,t,key);
return;
}
t=tm;
}
luaG_runerror(L,"loop in gettable");
}